

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O3

TestStatus *
vkt::pipeline::anon_unknown_0::testRenderToMipMaps
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  int *piVar1;
  VkSharingMode VVar2;
  VkFormat VVar3;
  int depth;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  undefined8 uVar5;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  deUint32 dVar11;
  undefined4 uVar12;
  VkShaderModule vertexModule;
  VkShaderModule fragmentModule;
  bool bVar13;
  deUint32 queueFamilyIndex;
  VkSharingMode subpassCount;
  int iVar14;
  uint uVar15;
  uint uVar16;
  VkResult VVar17;
  ChannelOrder CVar18;
  const_iterator it;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkDevice device;
  Allocator *allocator;
  TextureFormat TVar19;
  pointer puVar20;
  const_iterator cVar21;
  TextureFormat TVar22;
  DeviceInterface *vk_01;
  VkDevice device_00;
  VkQueue queue;
  TextureFormat TVar23;
  undefined8 *puVar24;
  long *plVar25;
  NotSupportedError *this;
  pointer pVVar26;
  void *pvVar27;
  size_type *psVar28;
  byte bVar29;
  deUint32 subpass;
  undefined4 uVar30;
  long lVar31;
  long lVar32;
  VkImageViewType viewType;
  VkDeviceSize VVar33;
  uint uVar34;
  pointer pVVar35;
  TestStatus *pTVar36;
  pointer pVVar37;
  VkPipeline basePipeline;
  ulong uVar38;
  ulong uVar39;
  VkFormatProperties VVar40;
  uint local_58c;
  long local_580;
  ConstPixelBufferAccess resultImage;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  VkAllocationCallbacks *pVStack_4f0;
  string comparisonName;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mipLevelStorageSizes;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> mipLevelSizes;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  value_type local_448;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> regions;
  VkAllocationCallbacks *pVStack_420;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_400;
  long *local_3e8;
  ulong local_3e0;
  TextureFormat local_3d8;
  deUint32 local_3cc;
  VkBufferCreateInfo bufferCreateInfo;
  TextureFormat local_358;
  int local_350;
  undefined4 local_34c;
  uint local_348;
  undefined4 local_344;
  VkSharingMode local_340;
  TextureFormat local_248;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_240;
  TextureFormat local_228;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_220;
  VkFramebuffer local_208;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_200;
  TestStatus *local_1e8;
  VkQueue local_1e0;
  undefined8 local_1d8;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  TextureFormat format;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_160;
  TextureFormat local_148;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_140;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  TextureFormat local_c0;
  VkShaderModule local_b8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_b0;
  undefined1 local_98 [40];
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_70;
  VkShaderModule local_58;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_50;
  
  checkImageViewTypeRequirements(context,caseDef->viewType);
  vk = Context::getDeviceInterface(context);
  vk_00 = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  local_3d8 = (TextureFormat)Context::getPhysicalDevice(context);
  local_1e0 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  local_448.m_data[0] = (caseDef->imageSizeHint).m_data[0];
  local_448.m_data[1] = (caseDef->imageSizeHint).m_data[1];
  uVar7 = *(undefined8 *)(caseDef->imageSizeHint).m_data;
  VVar2 = (caseDef->imageSizeHint).m_data[2];
  local_448.m_data[3] = (caseDef->imageSizeHint).m_data[3];
  local_3e0 = (ulong)(uint)local_448.m_data[3];
  subpassCount = local_448.m_data[3];
  if (local_448.m_data[3] < (int)VVar2) {
    subpassCount = VVar2;
  }
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.m_data[2] = VVar2;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
            (&mipLevelSizes,&local_448);
  while ((local_448.m_data[0] != 1 ||
         (local_448.m_data[2] != VK_SHARING_MODE_CONCURRENT || local_448.m_data[1] != 1))) {
    local_448.m_data[0] = local_448.m_data[0] >> 1;
    if (local_448.m_data[0] < 2) {
      local_448.m_data[0] = 1;
    }
    local_448.m_data[1] = local_448.m_data[1] >> 1;
    if (local_448.m_data[1] < 2) {
      local_448.m_data[1] = 1;
    }
    local_448.m_data[2] = local_448.m_data[2] >> 1;
    if (local_448.m_data[2] < 2) {
      local_448.m_data[2] = VK_SHARING_MODE_CONCURRENT;
    }
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
              (&mipLevelSizes,&local_448);
  }
  local_1e8 = __return_storage_ptr__;
  TVar19 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar14 = tcu::getPixelSize(TVar19);
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar37 = mipLevelSizes.
            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar26 = mipLevelSizes.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    pVVar35 = mipLevelSizes.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      bufferCreateInfo._0_8_ =
           (long)pVVar35->m_data[3] *
           (long)pVVar35->m_data[2] * (long)pVVar35->m_data[1] *
           (long)pVVar35->m_data[0] * (long)iVar14 + 0xfU & 0xfffffffffffffff0;
      if (mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&mipLevelStorageSizes,
                   (iterator)
                   mipLevelStorageSizes.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&bufferCreateInfo);
        pVVar26 = mipLevelSizes.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish = bufferCreateInfo._0_8_;
        mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pVVar35 = pVVar35 + 1;
      pVVar37 = mipLevelSizes.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (pVVar35 != pVVar26);
  }
  pVVar26 = mipLevelSizes.
            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  VVar3 = caseDef->depthStencilFormat;
  if ((VVar3 != VK_FORMAT_UNDEFINED) &&
     (VVar40 = ::vk::getPhysicalDeviceFormatProperties(vk_00,(VkPhysicalDevice)local_3d8,VVar3),
     (VVar40._0_8_ >> 0x29 & 1) == 0)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Unsupported depth/stencil format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
               ,0x4ee);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  VVar33 = 0;
  for (puVar20 = mipLevelStorageSizes.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puVar20 !=
      mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish; puVar20 = puVar20 + 1) {
    VVar33 = VVar33 + *puVar20;
  }
  makeBufferCreateInfo(&bufferCreateInfo,VVar33,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&resultImage,vk,device,
                     &bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_148 = resultImage.m_format;
  DStack_140.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
  DStack_140.m_device = (VkDevice)resultImage._16_8_;
  DStack_140.m_allocator = (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,(VkBuffer)resultImage.m_format,(MemoryRequirement)0x1);
  uVar9 = bufferCreateInfo._0_8_;
  memset(*(void **)(bufferCreateInfo._0_8_ + 0x18),0,VVar33);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar9 + 8),*(VkDeviceSize *)(uVar9 + 0x10),
             0xffffffffffffffff);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  TVar19 = (TextureFormat)(resultImage.m_size.m_data + 2);
  resultImage.m_format = TVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&resultImage,"vert","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&resultImage);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar21._M_node + 2),0);
  DStack_b0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_b8.m_internal = bufferCreateInfo._0_8_;
  DStack_b0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if (resultImage.m_format != TVar19) {
    operator_delete((void *)resultImage.m_format,resultImage._16_8_ + 1);
  }
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  resultImage.m_format = TVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&resultImage,"frag","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&resultImage);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar21._M_node + 2),0);
  DStack_50.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
  DStack_50.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_58.m_internal = bufferCreateInfo._0_8_;
  DStack_50.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if (resultImage.m_format != TVar19) {
    operator_delete((void *)resultImage.m_format,resultImage._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,vk,device);
  DStack_70.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
  DStack_70.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_98._32_8_ = bufferCreateInfo._0_8_;
  DStack_70.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  DStack_400.m_device = (VkDevice)0x0;
  DStack_400.m_allocator = (VkAllocationCallbacks *)0x0;
  DStack_400.m_deviceIface = (DeviceInterface *)0x0;
  DStack_220.m_device = (VkDevice)0x0;
  DStack_220.m_allocator = (VkAllocationCallbacks *)0x0;
  local_228.order = R;
  local_228.type = SNORM_INT8;
  DStack_220.m_deviceIface = (DeviceInterface *)0x0;
  DStack_240.m_device = (VkDevice)0x0;
  DStack_240.m_allocator = (VkAllocationCallbacks *)0x0;
  local_248.order = R;
  local_248.type = SNORM_INT8;
  DStack_240.m_deviceIface = (DeviceInterface *)0x0;
  uVar39 = (ulong)caseDef->viewType;
  bufferCreateInfo.flags = 0x20;
  if (uVar39 != 2) {
    bufferCreateInfo.flags = (uint)(uVar39 == 6 || uVar39 == 3) << 4;
  }
  bufferCreateInfo._20_4_ = 3;
  if (uVar39 < 7) {
    bufferCreateInfo._20_4_ = *(undefined4 *)(&DAT_00ae990c + uVar39 * 4);
  }
  bufferCreateInfo.size._0_4_ = caseDef->colorFormat;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  uVar15 = (uint)((ulong)((long)pVVar37 - (long)pVVar26) >> 4);
  bufferCreateInfo._44_4_ = SUB84(local_3e0,0);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo.sharingMode = VVar2;
  bufferCreateInfo.queueFamilyIndexCount = uVar15;
  bufferCreateInfo._28_8_ = uVar7;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&resultImage,vk,device,
                    (VkImageCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  TVar19 = resultImage.m_format;
  bufferCreateInfo.size._0_4_ = resultImage.m_pitch.m_data[1];
  bufferCreateInfo.size._4_4_ = resultImage.m_pitch.m_data[2];
  bufferCreateInfo.flags = resultImage.m_size.m_data[2];
  bufferCreateInfo._20_4_ = resultImage.m_pitch.m_data[0];
  bufferCreateInfo.pNext = (void *)resultImage.m_size.m_data._0_8_;
  bufferCreateInfo.sType = resultImage.m_format.order;
  bufferCreateInfo._4_4_ = resultImage.m_format.type;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
            device,allocator,(VkImage)TVar19,(MemoryRequirement)0x0);
  uVar10 = bufferCreateInfo._0_8_;
  if (VVar3 == VK_FORMAT_UNDEFINED) {
    local_3e8 = (long *)0x0;
  }
  else {
    bufferCreateInfo.size._0_4_ = caseDef->depthStencilFormat;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0;
    bufferCreateInfo._20_4_ = 1;
    bufferCreateInfo.sharingMode = VK_SHARING_MODE_CONCURRENT;
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
    bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
    bufferCreateInfo.queueFamilyIndexCount = uVar15;
    bufferCreateInfo._44_4_ = subpassCount;
    bufferCreateInfo._28_8_ = uVar7;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&resultImage,vk,device,
                      (VkImageCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    uVar8 = resultImage.m_pitch.m_data._4_8_;
    uVar6 = resultImage._16_8_;
    uVar7 = resultImage.m_size.m_data._0_8_;
    TVar22 = resultImage.m_format;
    bufferCreateInfo.flags = resultImage.m_size.m_data[2];
    bufferCreateInfo._20_4_ = resultImage.m_pitch.m_data[0];
    bufferCreateInfo.size._0_4_ = resultImage.m_pitch.m_data[1];
    bufferCreateInfo.size._4_4_ = resultImage.m_pitch.m_data[2];
    bufferCreateInfo.sType = resultImage.m_format.order;
    bufferCreateInfo._4_4_ = resultImage.m_format.type;
    bufferCreateInfo.pNext = (void *)resultImage.m_size.m_data._0_8_;
    resultImage.m_format.order = R;
    resultImage.m_format.type = SNORM_INT8;
    resultImage.m_size.m_data[0] = 0;
    resultImage.m_size.m_data[1] = 0;
    resultImage.m_size.m_data[2] = 0;
    resultImage.m_pitch.m_data[0] = 0;
    resultImage.m_pitch.m_data[1] = 0;
    resultImage.m_pitch.m_data[2] = 0;
    if (local_228 == (TextureFormat)0x0) {
      DStack_220.m_device = (VkDevice)uVar6;
      DStack_220.m_allocator = (VkAllocationCallbacks *)uVar8;
      local_228 = TVar22;
      DStack_220.m_deviceIface = (DeviceInterface *)uVar7;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&DStack_220,(VkImage)local_228);
      DStack_220.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
      local_228.order = bufferCreateInfo.sType;
      local_228.type = bufferCreateInfo._4_4_;
      DStack_220.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
      DStack_220.m_device = (VkDevice)bufferCreateInfo._16_8_;
      if (resultImage.m_format != (TextureFormat)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&resultImage.m_size,
                   (VkImage)resultImage.m_format);
      }
    }
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
              device,allocator,(VkImage)local_228,(MemoryRequirement)0x0);
    local_3e8 = (long *)bufferCreateInfo._0_8_;
  }
  genFullQuadVertices(&vertices,subpassCount);
  VVar33 = (long)vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,VVar33,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&resultImage,vk,device,
                     &bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  uVar8 = resultImage.m_pitch.m_data._4_8_;
  uVar6 = resultImage._16_8_;
  uVar7 = resultImage.m_size.m_data._0_8_;
  TVar22 = resultImage.m_format;
  bufferCreateInfo.flags = resultImage.m_size.m_data[2];
  bufferCreateInfo._20_4_ = resultImage.m_pitch.m_data[0];
  bufferCreateInfo.size._0_4_ = resultImage.m_pitch.m_data[1];
  bufferCreateInfo.size._4_4_ = resultImage.m_pitch.m_data[2];
  bufferCreateInfo.sType = resultImage.m_format.order;
  bufferCreateInfo._4_4_ = resultImage.m_format.type;
  bufferCreateInfo.pNext = (void *)resultImage.m_size.m_data._0_8_;
  resultImage.m_format.order = R;
  resultImage.m_format.type = SNORM_INT8;
  resultImage.m_size.m_data[0] = 0;
  resultImage.m_size.m_data[1] = 0;
  resultImage.m_size.m_data[2] = 0;
  resultImage.m_pitch.m_data[0] = 0;
  resultImage.m_pitch.m_data[1] = 0;
  resultImage.m_pitch.m_data[2] = 0;
  if (local_248 == (TextureFormat)0x0) {
    DStack_240.m_device = (VkDevice)uVar6;
    DStack_240.m_allocator = (VkAllocationCallbacks *)uVar8;
    local_248 = TVar22;
    DStack_240.m_deviceIface = (DeviceInterface *)uVar7;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_240,(VkBuffer)local_248);
    DStack_240.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
    local_248.order = bufferCreateInfo.sType;
    local_248.type = bufferCreateInfo._4_4_;
    DStack_240.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
    DStack_240.m_device = (VkDevice)bufferCreateInfo._16_8_;
    if (resultImage.m_format != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&resultImage.m_size,
                 (VkBuffer)resultImage.m_format);
    }
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,(VkBuffer)local_248,(MemoryRequirement)0x1);
  uVar7 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,VVar33);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar7 + 8),*(VkDeviceSize *)(uVar7 + 0x10),
             VVar33);
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,2,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  resultImage.m_pitch.m_data[2] = bufferCreateInfo.size._4_4_;
  resultImage.m_pitch.m_data[1] = (VkStructureType)bufferCreateInfo.size;
  resultImage.m_size.m_data[2] = bufferCreateInfo.flags;
  resultImage.m_pitch.m_data[0] = bufferCreateInfo._20_4_;
  resultImage.m_format.order = bufferCreateInfo.sType;
  resultImage.m_format.type = bufferCreateInfo._4_4_;
  resultImage.m_size.m_data._0_8_ = bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  uVar6 = bufferCreateInfo._0_8_;
  pVStack_4f0 = (VkAllocationCallbacks *)
                CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
  beginCommandBuffer(vk,(VkCommandBuffer)bufferCreateInfo._0_8_);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0x100;
  bufferCreateInfo.size._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo.size._4_4_ = 2;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = TVar19.order;
  dVar11 = bufferCreateInfo.queueFamilyIndexCount;
  bufferCreateInfo._44_4_ = TVar19.type;
  uVar12 = bufferCreateInfo._44_4_;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  local_358 = local_228;
  local_350 = 0;
  if (caseDef->depthStencilFormat != VK_FORMAT_UNDEFINED) {
    TVar22 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
    uVar16 = TVar22.order - D;
    local_350 = 1;
    if (uVar16 < 3) {
      local_350 = uVar16 * 2 + 2;
    }
  }
  local_34c = 0;
  local_344 = 0;
  local_348 = uVar15;
  local_340 = subpassCount;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,uVar6,1,0x80,0,0,0,0,0,2 - (uint)(VVar3 == VK_FORMAT_UNDEFINED),
             (int)&bufferCreateInfo);
  VVar17 = (*vk->_vptr_DeviceInterface[0x4a])(vk,uVar6);
  ::vk::checkResult(VVar17,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x557);
  submitCommandsAndWait(vk,device,local_1e0,(VkCommandBuffer)uVar6);
  if (uVar6 != 0) {
    bufferCreateInfo._0_8_ = uVar6;
    (**(code **)(*(long *)((vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->position).m_data + 0x240))
              (vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pVStack_4f0,1);
  }
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&resultImage.m_size,
               (VkCommandPool)resultImage.m_format);
  }
  if (0 < (int)uVar15) {
    uVar39 = 0;
    do {
      fragmentModule.m_internal = local_58.m_internal;
      uVar6 = local_98._32_8_;
      vertexModule.m_internal = local_b8.m_internal;
      TVar22 = local_228;
      pVVar37 = mipLevelSizes.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar16 = mipLevelSizes.
               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar39].m_data[3];
      if (mipLevelSizes.
          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar39].m_data[3] <
          mipLevelSizes.
          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar39].m_data[2]) {
        uVar16 = mipLevelSizes.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar39].m_data[2];
      }
      local_3d8 = TVar19;
      local_c0 = local_248;
      vk_01 = Context::getDeviceInterface(context);
      device_00 = Context::getDevice(context);
      queue = Context::getUniversalQueue(context);
      local_3cc = Context::getUniversalQueueFamilyIndex(context);
      if (caseDef->depthStencilFormat == VK_FORMAT_UNDEFINED) {
        bVar13 = false;
        local_58c = 0;
      }
      else {
        TVar23 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
        bVar13 = true;
        CVar18 = TVar23.order;
        if (CVar18 == DS) {
          local_58c = 6;
        }
        else if (CVar18 == S) {
          local_58c = 4;
          bVar13 = true;
        }
        else {
          if (CVar18 == D) {
            local_58c = 2;
          }
          else {
            local_58c = 1;
          }
          bVar13 = false;
        }
      }
      makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&bufferCreateInfo,vk_01,device_00,
                     caseDef->colorFormat,caseDef->depthStencilFormat,uVar16,
                     VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                     VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
      pVVar37 = pVVar37 + uVar39;
      resultImage.m_pitch.m_data[2] = bufferCreateInfo.size._4_4_;
      resultImage.m_pitch.m_data[1] = (VkStructureType)bufferCreateInfo.size;
      resultImage.m_size.m_data[2] = bufferCreateInfo.flags;
      resultImage.m_pitch.m_data[0] = bufferCreateInfo._20_4_;
      resultImage.m_format.order = bufferCreateInfo.sType;
      resultImage.m_format.type = bufferCreateInfo._4_4_;
      resultImage.m_size.m_data._0_8_ = bufferCreateInfo.pNext;
      pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      colorAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      colorAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depthStencilAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      depthStencilAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depthStencilAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((int)uVar16 < 1) {
        uVar34 = (uint)(byte)(bVar13 | (byte)((local_58c & 2) >> 1));
      }
      else {
        subpass = 0;
        basePipeline.m_internal = 0;
        do {
          viewType = VK_IMAGE_VIEW_TYPE_LAST;
          if ((ulong)caseDef->viewType < 7) {
            viewType = *(VkImageViewType *)(&DAT_00ae9928 + (ulong)caseDef->viewType * 4);
          }
          subresourceRange.baseMipLevel = (int)uVar39;
          subresourceRange.aspectMask = 1;
          subresourceRange.levelCount = 1;
          subresourceRange.baseArrayLayer = subpass;
          subresourceRange.layerCount = 1;
          makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&vertices,vk_01,device_00,
                        (VkImage)local_3d8,viewType,caseDef->colorFormat,subresourceRange);
          puVar24 = (undefined8 *)operator_new(0x20);
          puVar24[2] = vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar24[3] = pVStack_4f0;
          *puVar24 = vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          puVar24[1] = vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bufferCreateInfo.pNext = (void *)0x0;
          bufferCreateInfo._0_8_ = puVar24;
          bufferCreateInfo.pNext = operator_new(0x20);
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
          *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d24850;
          *(undefined8 **)((long)bufferCreateInfo.pNext + 0x10) = puVar24;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                      *)&colorAttachments,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                     &bufferCreateInfo);
          if (bufferCreateInfo.pNext != (void *)0x0) {
            LOCK();
            piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              bufferCreateInfo._4_4_ = 0;
              (**(code **)(*bufferCreateInfo.pNext + 0x10))();
            }
            LOCK();
            piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (bufferCreateInfo.pNext != (void *)0x0) {
                (**(code **)(*bufferCreateInfo.pNext + 8))();
              }
              bufferCreateInfo.pNext = (void *)0x0;
            }
          }
          if (vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                       &vertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (VkImageView)
                       vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVStack_4f0 = (VkAllocationCallbacks *)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if (attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
            _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                      ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                        *)&attachmentHandles,
                       (iterator)
                       attachmentHandles.
                       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Handle<(vk::HandleType)13> *)
                       colorAttachments.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
          }
          else {
            (attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
                 ((colorAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
                 super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
            attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 attachmentHandles.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          makeGraphicsPipeline
                    ((Move<vk::Handle<(vk::HandleType)18>_> *)&regions,vk_01,device_00,basePipeline,
                     (VkPipelineLayout)uVar6,(VkRenderPass)resultImage.m_format,vertexModule,
                     fragmentModule,(IVec2 *)(ulong)(uint)pVVar37->m_data[0],pVVar37->m_data[1],
                     subpass,SUB41((local_58c & 2) >> 1,0),bVar13);
          puVar24 = (undefined8 *)operator_new(0x20);
          puVar24[2] = regions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar24[3] = pVStack_420;
          *puVar24 = regions.
                     super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          puVar24[1] = regions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bufferCreateInfo.pNext = (void *)0x0;
          bufferCreateInfo._0_8_ = puVar24;
          bufferCreateInfo.pNext = operator_new(0x20);
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
          *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d24a90;
          *(undefined8 **)((long)bufferCreateInfo.pNext + 0x10) = puVar24;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                      *)&pipelines,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                     &bufferCreateInfo);
          if (bufferCreateInfo.pNext != (void *)0x0) {
            LOCK();
            piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              bufferCreateInfo._4_4_ = 0;
              (**(code **)(*bufferCreateInfo.pNext + 0x10))();
            }
            LOCK();
            piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (bufferCreateInfo.pNext != (void *)0x0) {
                (**(code **)(*bufferCreateInfo.pNext + 8))();
              }
              bufferCreateInfo.pNext = (void *)0x0;
            }
          }
          if (regions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)18>_> *)
                       &regions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (VkPipeline)
                       regions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVStack_420 = (VkAllocationCallbacks *)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          basePipeline.m_internal =
               ((pipelines.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
               super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
          subpass = subpass + 1;
        } while (uVar16 != subpass);
        uVar34 = 0;
        if ((~bVar13 & (local_58c & 2) == 0) == 0) {
          do {
            subresourceRange_00.baseMipLevel = (int)uVar39;
            subresourceRange_00.aspectMask = local_58c;
            subresourceRange_00.levelCount = 1;
            subresourceRange_00.baseArrayLayer = uVar34;
            subresourceRange_00.layerCount = 1;
            makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&comparisonName,vk_01,device_00,
                          (VkImage)TVar22,VK_IMAGE_VIEW_TYPE_2D,caseDef->depthStencilFormat,
                          subresourceRange_00);
            puVar24 = (undefined8 *)operator_new(0x20);
            puVar24[2] = comparisonName.field_2._M_allocated_capacity;
            puVar24[3] = comparisonName.field_2._8_8_;
            *puVar24 = comparisonName._M_dataplus._M_p;
            puVar24[1] = comparisonName._M_string_length;
            comparisonName._M_dataplus._M_p = (pointer)0x0;
            comparisonName._M_string_length = 0;
            comparisonName.field_2._M_allocated_capacity = 0;
            comparisonName.field_2._8_8_ = 0;
            bufferCreateInfo.pNext = (void *)0x0;
            bufferCreateInfo._0_8_ = puVar24;
            bufferCreateInfo.pNext = operator_new(0x20);
            *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
            *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
            *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d24850;
            *(undefined8 **)((long)bufferCreateInfo.pNext + 0x10) = puVar24;
            *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
            *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
            ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                      ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                        *)&depthStencilAttachments,
                       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                       &bufferCreateInfo);
            if (bufferCreateInfo.pNext != (void *)0x0) {
              LOCK();
              piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                bufferCreateInfo._4_4_ = 0;
                (**(code **)(*bufferCreateInfo.pNext + 0x10))();
              }
              LOCK();
              piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (bufferCreateInfo.pNext != (void *)0x0) {
                  (**(code **)(*bufferCreateInfo.pNext + 8))();
                }
                bufferCreateInfo.pNext = (void *)0x0;
              }
            }
            if (comparisonName._M_dataplus._M_p != (pointer)0x0) {
              ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                        ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                         &comparisonName._M_string_length,
                         (VkImageView)comparisonName._M_dataplus._M_p);
            }
            comparisonName.field_2._M_allocated_capacity = 0;
            comparisonName.field_2._8_8_ = 0;
            comparisonName._M_dataplus._M_p = (pointer)0x0;
            comparisonName._M_string_length = 0;
            if (attachmentHandles.
                super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                attachmentHandles.
                super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
              ::_M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                        ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                          *)&attachmentHandles,
                         (iterator)
                         attachmentHandles.
                         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (Handle<(vk::HandleType)13> *)
                         depthStencilAttachments.
                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
            }
            else {
              (attachmentHandles.
               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
                   ((depthStencilAttachments.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
                   super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
              attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   attachmentHandles.
                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar34 = uVar34 + 1;
          } while (uVar16 != uVar34);
          uVar34 = 1;
        }
      }
      makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo,vk_01,device_00,
                      (VkRenderPass)resultImage.m_format,
                      (deUint32)
                      ((ulong)((long)attachmentHandles.
                                     super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)attachmentHandles.
                                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3),
                      attachmentHandles.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,pVVar37->m_data[0],
                      pVVar37->m_data[1],1);
      DStack_200.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
      DStack_200.m_device = (VkDevice)bufferCreateInfo._16_8_;
      local_208.m_internal = bufferCreateInfo._0_8_;
      DStack_200.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
      ::vk::createCommandPool
                ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk_01,device_00,2,
                 local_3cc,(VkAllocationCallbacks *)0x0);
      DStack_160.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
      DStack_160.m_device = (VkDevice)bufferCreateInfo._16_8_;
      format.order = bufferCreateInfo.sType;
      format.type = bufferCreateInfo._4_4_;
      DStack_160.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
      makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk_01,device_00,
                        (VkCommandPool)bufferCreateInfo._0_8_);
      uVar6 = bufferCreateInfo._0_8_;
      local_98._24_8_ = CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size)
      ;
      local_98._16_8_ = bufferCreateInfo._16_8_;
      local_98._0_8_ = bufferCreateInfo._0_8_;
      local_98._8_8_ = bufferCreateInfo.pNext;
      beginCommandBuffer(vk_01,(VkCommandBuffer)bufferCreateInfo._0_8_);
      VVar3 = caseDef->colorFormat;
      bVar13 = ::vk::isUintFormat(VVar3);
      pvVar27 = (void *)0x7d0000007d;
      if (!bVar13) {
        bVar13 = ::vk::isIntFormat(VVar3);
        pvVar27 = (void *)0x3f8000003f800000;
        if (bVar13) {
          pvVar27 = (void *)0x7d0000007d;
        }
      }
      bufferCreateInfo._0_8_ = pvVar27;
      bufferCreateInfo.pNext = pvVar27;
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
                (&clearValues,(long)(int)uVar16,(value_type *)&bufferCreateInfo,
                 (allocator_type *)&local_1d8);
      if ((char)uVar34 != '\0') {
        bufferCreateInfo.sType = 0x3f800000;
        bufferCreateInfo._4_4_ = 0x2a;
        std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::_M_fill_insert
                  (&clearValues,
                   (iterator)
                   clearValues.
                   super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long)(int)uVar16,
                   (value_type *)&bufferCreateInfo);
      }
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo.flags = resultImage.m_format.order;
      bufferCreateInfo._20_4_ = resultImage.m_format.type;
      bufferCreateInfo.size._0_4_ = (VkStructureType)local_208.m_internal;
      bufferCreateInfo.size._4_4_ = (int)(local_208.m_internal >> 0x20);
      bufferCreateInfo.usage = 0;
      bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      bufferCreateInfo.queueFamilyIndexCount = (deUint32)*(undefined8 *)pVVar37->m_data;
      bufferCreateInfo._44_4_ = SUB84((ulong)*(undefined8 *)pVVar37->m_data >> 0x20,0);
      bufferCreateInfo.pQueueFamilyIndices._0_4_ =
           (undefined4)
           ((ulong)((long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)clearValues.
                         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 4);
      local_1d8 = 0;
      (*vk_01->_vptr_DeviceInterface[0x74])(vk_01,uVar6,(value_type *)&bufferCreateInfo,0);
      (*vk_01->_vptr_DeviceInterface[0x58])(vk_01,uVar6,0,1,&local_c0);
      if (clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(clearValues.
                        super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)clearValues.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)clearValues.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (uVar16 != 0) {
        uVar38 = 0;
        do {
          if (uVar38 != 0) {
            (*vk_01->_vptr_DeviceInterface[0x75])(vk_01,uVar6,0);
          }
          (*vk_01->_vptr_DeviceInterface[0x4c])
                    (vk_01,uVar6,0,
                     **(undefined8 **)
                       ((long)&(pipelines.
                                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar38 * 4));
          (*vk_01->_vptr_DeviceInterface[0x59])(vk_01,uVar6,4,1,uVar38 & 0xffffffff);
          uVar38 = uVar38 + 4;
        } while ((ulong)uVar16 << 2 != uVar38);
      }
      (*vk_01->_vptr_DeviceInterface[0x76])(vk_01,uVar6);
      VVar17 = (*vk_01->_vptr_DeviceInterface[0x4a])(vk_01,uVar6);
      ::vk::checkResult(VVar17,"vk.endCommandBuffer(*cmdBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                        ,0x4d4);
      submitCommandsAndWait(vk_01,device_00,queue,(VkCommandBuffer)uVar6);
      if (uVar6 != 0) {
        bufferCreateInfo._0_8_ = uVar6;
        (**(code **)(*(long *)local_98._8_8_ + 0x240))
                  (local_98._8_8_,local_98._16_8_,local_98._24_8_,1,&bufferCreateInfo);
      }
      if (format != (TextureFormat)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&DStack_160,(VkCommandPool)format);
      }
      if (local_208.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  (&DStack_200,local_208);
      }
      if (attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(attachmentHandles.
                        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)attachmentHandles.
                              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)attachmentHandles.
                              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::~vector(&depthStencilAttachments);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::~vector(&colorAttachments);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::~vector(&pipelines);
      if (resultImage.m_format != (TextureFormat)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)17>_> *)&resultImage.m_size,
                   (VkRenderPass)resultImage.m_format);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != (uVar15 & 0x7fffffff));
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,2,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  resultImage.m_pitch.m_data[2] = bufferCreateInfo.size._4_4_;
  resultImage.m_pitch.m_data[1] = (VkStructureType)bufferCreateInfo.size;
  resultImage.m_size.m_data[2] = bufferCreateInfo.flags;
  resultImage.m_pitch.m_data[0] = bufferCreateInfo._20_4_;
  resultImage.m_format.order = bufferCreateInfo.sType;
  resultImage.m_format.type = bufferCreateInfo._4_4_;
  resultImage.m_size.m_data._0_8_ = bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  uVar8 = bufferCreateInfo._0_8_;
  uVar6 = CONCAT44(bufferCreateInfo.size._4_4_,(VkStructureType)bufferCreateInfo.size);
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
  beginCommandBuffer(vk,(VkCommandBuffer)bufferCreateInfo._0_8_);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  bufferCreateInfo._20_4_ = 0x800;
  bufferCreateInfo.size._0_4_ = 2;
  bufferCreateInfo.size._4_4_ = 6;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  uVar30 = (undefined4)local_3e0;
  bufferCreateInfo.queueFamilyIndexCount = dVar11;
  bufferCreateInfo._44_4_ = uVar12;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar8,0x400,0x1000,0,0,0,0,0,1,(int)&bufferCreateInfo);
  uVar39 = 0;
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 1;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  lVar32 = 8;
  lVar31 = 0;
  bufferCreateInfo.size._4_4_ = uVar30;
  do {
    bufferCreateInfo._20_4_ = (int)uVar39;
    uVar5 = *(undefined8 *)
             ((long)(mipLevelSizes.
                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->m_data + lVar32 + -8);
    bufferCreateInfo.pQueueFamilyIndices._4_4_ =
         *(undefined4 *)
          ((long)(mipLevelSizes.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->m_data + lVar32);
    bufferCreateInfo._44_4_ = SUB84(uVar5,0);
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    bufferCreateInfo._0_8_ = lVar31;
    if (regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>::
      _M_realloc_insert<vk::VkBufferImageCopy_const&>
                ((vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>> *)&regions,
                 (iterator)
                 regions.
                 super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(VkBufferImageCopy *)&bufferCreateInfo);
    }
    else {
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageExtent).height =
           bufferCreateInfo.pQueueFamilyIndices._0_4_;
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageExtent).depth =
           bufferCreateInfo.pQueueFamilyIndices._4_4_;
      bufferCreateInfo.sType = (VkStructureType)lVar31;
      bufferCreateInfo._4_4_ = SUB84((ulong)lVar31 >> 0x20,0);
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageOffset).x = bufferCreateInfo.usage;
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageOffset).y = bufferCreateInfo.sharingMode;
      *(ulong *)&((regions.
                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).z =
           CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount);
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).aspectMask =
           bufferCreateInfo.flags;
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).mipLevel = (int)uVar39;
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).baseArrayLayer =
           (VkStructureType)bufferCreateInfo.size;
      ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).layerCount =
           bufferCreateInfo.size._4_4_;
      *(VkStructureType *)
       &(regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
         _M_impl.super__Vector_impl_data._M_finish)->bufferOffset = bufferCreateInfo.sType;
      *(undefined4 *)
       ((long)&(regions.
                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                _M_impl.super__Vector_impl_data._M_finish)->bufferOffset + 4) =
           bufferCreateInfo._4_4_;
      (regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
       _M_impl.super__Vector_impl_data._M_finish)->bufferRowLength =
           (deUint32)bufferCreateInfo.pNext;
      (regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
       _M_impl.super__Vector_impl_data._M_finish)->bufferImageHeight = bufferCreateInfo.pNext._4_4_;
      regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    lVar31 = lVar31 + mipLevelStorageSizes.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar39];
    uVar39 = uVar39 + 1;
    lVar32 = lVar32 + 0x10;
  } while ((uVar15 & 0x7fffffff) != uVar39);
  (*vk->_vptr_DeviceInterface[99])
            (vk,uVar8,TVar19,6,local_148,
             (ulong)(uint)((int)((ulong)((long)regions.
                                               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)regions.
                                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249),
             (int)regions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  if (regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(regions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)regions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)regions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x1000;
  bufferCreateInfo._20_4_ = 0x2000;
  bufferCreateInfo.size._0_4_ = 0xffffffff;
  bufferCreateInfo.size._4_4_ = 0xffffffff;
  bufferCreateInfo.usage = local_148.order;
  bufferCreateInfo.sharingMode = local_148.type;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0xffffffff;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0xffffffff;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar8,0x1000,0x4000,0,0,0,1,(int)&bufferCreateInfo,0,0);
  VVar17 = (*vk->_vptr_DeviceInterface[0x4a])(vk,uVar8);
  ::vk::checkResult(VVar17,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x5b4);
  submitCommandsAndWait(vk,device,local_1e0,(VkCommandBuffer)uVar8);
  if (uVar8 != 0) {
    bufferCreateInfo._0_8_ = uVar8;
    (**(code **)(*(long *)((vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->position).m_data + 0x240))
              (vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar6,1);
  }
  if (resultImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&resultImage.m_size,
               (VkCommandPool)resultImage.m_format);
  }
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar9 + 8),*(VkDeviceSize *)(uVar9 + 0x10),
             0xffffffffffffffff);
  format = ::vk::mapVkFormat(caseDef->colorFormat);
  if (0 < (int)uVar15) {
    bVar29 = 1;
    lVar31 = 0;
    uVar39 = 0;
    local_580 = 0;
    do {
      pVVar37 = mipLevelSizes.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar14 = *(int *)((long)(mipLevelSizes.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar31 + 8);
      depth = *(int *)((long)(mipLevelSizes.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar31 + 0xc);
      if (depth < iVar14) {
        depth = iVar14;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&resultImage,&format,
                 *(int *)((long)(mipLevelSizes.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar31),
                 *(int *)((long)(mipLevelSizes.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar31 + 4),
                 depth,(void *)(*(long *)(uVar9 + 0x18) + local_580));
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&vertices,&format,*(int *)((long)pVVar37->m_data + lVar31),
                 *(int *)((long)pVVar37->m_data + lVar31 + 4),depth);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&regions,(TextureLevel *)&vertices);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufferCreateInfo);
      std::ostream::operator<<(&bufferCreateInfo,(int)uVar39);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufferCreateInfo);
      std::ios_base::~ios_base((ios_base *)&local_358);
      plVar25 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0xae9b34);
      comparisonName._M_dataplus._M_p = (pointer)&comparisonName.field_2;
      psVar28 = (size_type *)(plVar25 + 2);
      if ((size_type *)*plVar25 == psVar28) {
        comparisonName.field_2._M_allocated_capacity = *psVar28;
        comparisonName.field_2._8_8_ = plVar25[3];
      }
      else {
        comparisonName.field_2._M_allocated_capacity = *psVar28;
        comparisonName._M_dataplus._M_p = (pointer)*plVar25;
      }
      comparisonName._M_string_length = plVar25[1];
      *plVar25 = (long)psVar28;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      if ((VkDevice *)local_208.m_internal != &DStack_200.m_device) {
        operator_delete((void *)local_208.m_internal,(ulong)(DStack_200.m_device + 1));
      }
      bufferCreateInfo._0_8_ = *(undefined8 *)((long)pVVar37->m_data + lVar31);
      generateExpectedImage((PixelBufferAccess *)&regions,(IVec2 *)&bufferCreateInfo,0);
      bVar13 = ::vk::isFloatFormat(caseDef->colorFormat);
      log = context->m_testCtx->m_log;
      if (bVar13) {
        bufferCreateInfo.sType = 0x3c23d70a;
        bufferCreateInfo._4_4_ = 0x3c23d70a;
        bufferCreateInfo.pNext = (void *)0x3c23d70a3c23d70a;
        bVar13 = tcu::floatThresholdCompare
                           (log,"Image Comparison",comparisonName._M_dataplus._M_p,
                            (ConstPixelBufferAccess *)&regions,&resultImage,
                            (Vec4 *)&bufferCreateInfo,COMPARE_LOG_RESULT);
      }
      else {
        bufferCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
        bufferCreateInfo._4_4_ = 2;
        bufferCreateInfo.pNext = (void *)0x200000002;
        bVar13 = tcu::intThresholdCompare
                           (log,"Image Comparison",comparisonName._M_dataplus._M_p,
                            (ConstPixelBufferAccess *)&regions,&resultImage,
                            (UVec4 *)&bufferCreateInfo,COMPARE_LOG_RESULT);
      }
      local_580 = local_580 +
                  mipLevelStorageSizes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar39];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)comparisonName._M_dataplus._M_p != &comparisonName.field_2) {
        operator_delete(comparisonName._M_dataplus._M_p,
                        comparisonName.field_2._M_allocated_capacity + 1);
      }
      bVar29 = bVar29 & bVar13;
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&vertices);
      uVar39 = uVar39 + 1;
      lVar31 = lVar31 + 0x10;
    } while ((uVar15 & 0x7fffffff) != uVar39);
    if (bVar29 == 0) {
      bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
      std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Fail","");
      pTVar36 = local_1e8;
      local_1e8->m_code = QP_TEST_RESULT_FAIL;
      (local_1e8->m_description)._M_dataplus._M_p = (pointer)&(local_1e8->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8->m_description,bufferCreateInfo._0_8_,
                 (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
      goto LAB_004fa18a;
    }
  }
  bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Pass","");
  pTVar36 = local_1e8;
  local_1e8->m_code = QP_TEST_RESULT_PASS;
  (local_1e8->m_description)._M_dataplus._M_p = (pointer)&(local_1e8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8->m_description,bufferCreateInfo._0_8_,
             (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
LAB_004fa18a:
  if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
  }
  if (uVar7 != 0) {
    (**(code **)(*(long *)uVar7 + 8))();
  }
  if (local_248 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_240,(VkBuffer)local_248);
  }
  if (local_3e8 != (long *)0x0) {
    (**(code **)(*local_3e8 + 8))();
  }
  if (local_228 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_220,(VkImage)local_228);
  }
  if (uVar10 != 0) {
    (**(code **)(*(long *)uVar10 + 8))();
  }
  if (TVar19 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_400,(VkImage)TVar19);
  }
  if (local_98._32_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_70,(VkPipelineLayout)local_98._32_8_);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_50,local_58);
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_b0,local_b8);
  }
  if (uVar9 != 0) {
    (**(code **)(*(long *)uVar9 + 8))();
  }
  if (local_148 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_140,(VkBuffer)local_148);
  }
  if (mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mipLevelStorageSizes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mipLevelStorageSizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mipLevelStorageSizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mipLevelSizes.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)mipLevelSizes.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)mipLevelSizes.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar36;
}

Assistant:

tcu::TestStatus testRenderToMipMaps (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const InstanceInterface&		vki					= context.getInstanceInterface();
	const VkDevice					device				= context.getDevice();
	const VkPhysicalDevice			physDevice			= context.getPhysicalDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec4						imageSize				= caseDef.imageSizeHint;	// MAX_SIZE is not used in this test
	const deInt32					numSlices				= maxLayersOrDepth(imageSize);
	const vector<IVec4>				mipLevelSizes			= getMipLevelSizes(imageSize);
	const vector<VkDeviceSize>		mipLevelStorageSizes	= getPerMipLevelStorageSize(mipLevelSizes, tcu::getPixelSize(mapVkFormat(caseDef.colorFormat)));
	const int						numMipLevels			= static_cast<int>(mipLevelSizes.size());
	const bool						useDepthStencil			= (caseDef.depthStencilFormat != VK_FORMAT_UNDEFINED);

	if (useDepthStencil && !isDepthStencilFormatSupported(vki, physDevice, caseDef.depthStencilFormat))
		TCU_THROW(NotSupportedError, "Unsupported depth/stencil format");

	// Create a color buffer big enough to hold all layers and mip levels
	const VkDeviceSize				colorBufferSize		= sum(mipLevelStorageSizes);
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	{
		deMemset(colorBufferAlloc->getHostPtr(), 0, static_cast<std::size_t>(colorBufferSize));
		flushMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
	}

	const Unique<VkShaderModule>	vertexModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("frag"), 0u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout	(vk, device));

	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;
	Move<VkImage>					depthStencilImage;
	MovePtr<Allocation>				depthStencilImageAlloc;
	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	// Create a color image
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

		colorImage		= makeImage(vk, device, getImageCreateFlags(caseDef.viewType), getImageType(caseDef.viewType), caseDef.colorFormat,
									imageSize.swizzle(0, 1, 2), numMipLevels, imageSize.w(), imageUsage);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);
	}

	// Create a depth/stencil image (always a 2D image, optionally layered)
	if (useDepthStencil)
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;

		depthStencilImage		= makeImage(vk, device, (VkImageCreateFlags)0, VK_IMAGE_TYPE_2D, caseDef.depthStencilFormat,
											IVec3(imageSize.x(), imageSize.y(), 1), numMipLevels, numSlices, imageUsage);
		depthStencilImageAlloc	= bindImage(vk, device, allocator, *depthStencilImage, MemoryRequirement::Any);
	}

	// Create a vertex buffer
	{
		const vector<Vertex4RGBA>	vertices			= genFullQuadVertices(numSlices);
		const VkDeviceSize			vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Prepare images
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		const VkImageMemoryBarrier	imageBarriers[]	=
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*colorImage,										// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
				},
			},
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*depthStencilImage,									// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					getFormatAspectFlags(caseDef.depthStencilFormat),	// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(numSlices),					// uint32_t              layerCount;
				},
			}
		};

		const deUint32	numImageBarriers = static_cast<deUint32>(DE_LENGTH_OF_ARRAY(imageBarriers) - (useDepthStencil ? 0 : 1));

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
								0u, DE_NULL, 0u, DE_NULL, numImageBarriers, imageBarriers);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Draw
	for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
	{
		const IVec4&	mipSize		= mipLevelSizes[mipLevel];
		const int		levelSlices	= maxLayersOrDepth(mipSize);

		drawToMipLevel (context, caseDef, mipLevel, mipSize, levelSlices, *colorImage, *depthStencilImage, *vertexBuffer, *pipelineLayout,
						*vertexModule, *fragmentModule);
	}

	// Copy results: colorImage -> host visible colorBuffer
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType            sType;
					DE_NULL,										// const void*                pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags              srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags              dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout              oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout              newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   dstQueueFamilyIndex;
					*colorImage,									// VkImage                    image;
					{												// VkImageSubresourceRange    subresourceRange;
						VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
						0u,													// uint32_t              baseMipLevel;
						static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
						0u,													// uint32_t              baseArrayLayer;
						static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
					},
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
									0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(imageBarriers), imageBarriers);
		}
		{
			vector<VkBufferImageCopy>	regions;
			VkDeviceSize				levelOffset = 0ull;
			VkBufferImageCopy			workRegion	=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, imageSize.w()),		// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(0, 0, 0),																// VkExtent3D                  imageExtent;
			};

			for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
			{
				workRegion.bufferOffset					= levelOffset;
				workRegion.imageSubresource.mipLevel	= static_cast<deUint32>(mipLevel);
				workRegion.imageExtent					= makeExtent3D(mipLevelSizes[mipLevel].swizzle(0, 1, 2));

				regions.push_back(workRegion);

				levelOffset += mipLevelStorageSizes[mipLevel];
			}

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, static_cast<deUint32>(regions.size()), &regions[0]);
		}
		{
			const VkBufferMemoryBarrier	bufferBarriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
									0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results (per mip level)
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);

		const tcu::TextureFormat			format			= mapVkFormat(caseDef.colorFormat);

		VkDeviceSize						levelOffset		= 0ull;
		bool								allOk			= true;

		for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
		{
			const IVec4&						mipSize			= mipLevelSizes[mipLevel];
			const void*	const					pLevelData		= static_cast<const deUint8*>(colorBufferAlloc->getHostPtr()) + levelOffset;
			const int							levelDepth		= maxLayersOrDepth(mipSize);
			const tcu::ConstPixelBufferAccess	resultImage		(format, mipSize.x(), mipSize.y(), levelDepth, pLevelData);
			tcu::TextureLevel					textureLevel	(format, mipSize.x(), mipSize.y(), levelDepth);
			const tcu::PixelBufferAccess		expectedImage	= textureLevel.getAccess();
			const std::string					comparisonName	= "Mip level " + de::toString(mipLevel);
			bool								ok				= false;

			generateExpectedImage(expectedImage, mipSize.swizzle(0, 1), 0);

			if (isFloatFormat(caseDef.colorFormat))
				ok = tcu::floatThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
			else
				ok = tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::UVec4(2), tcu::COMPARE_LOG_RESULT);

			allOk		=  allOk && ok;	// keep testing all levels, even if we know it's a fail overall
			levelOffset += mipLevelStorageSizes[mipLevel];
		}

		return allOk ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Fail");
	}
}